

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::RenderIndexBuffer::verify
          (RenderIndexBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  byte bVar1;
  byte bVar2;
  ulong in_RAX;
  ulong uVar3;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  if (1 < this->m_bufferSize) {
    uVar3 = 0;
    do {
      bVar1 = *(byte *)(*(long *)(*(long *)ctx + 0x18) + uVar3 * 2);
      bVar2 = *(byte *)(*(long *)(*(long *)ctx + 0x18) + 1 + uVar3 * 2);
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
      local_68.m_data[0] = 1.0;
      local_68.m_data[1] = 1.0;
      local_68.m_data[2] = 1.0;
      local_68.m_data[3] = 1.0;
      tcu::PixelBufferAccess::setPixel(&local_58,&local_68,(uint)bVar1,(uint)bVar2,0);
      uVar3 = uVar3 + 1;
      in_RAX = this->m_bufferSize >> 1;
    } while (uVar3 < in_RAX);
  }
  return (int)in_RAX;
}

Assistant:

void RenderIndexBuffer::verify (VerifyRenderPassContext& context, size_t)
{
	for (size_t pos = 0; pos < (size_t)m_bufferSize / 2; pos++)
	{
		const deUint8 x  = context.getReference().get(pos * 2);
		const deUint8 y  = context.getReference().get((pos * 2) + 1);

		context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), x, y);
	}
}